

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

ssize_t strhex_from_bin(char *buffer,size_t buffer_len,uint8_t *src,size_t src_len)

{
  char *pcVar1;
  char *local_40;
  size_t j;
  size_t i;
  size_t src_len_local;
  uint8_t *src_local;
  size_t buffer_len_local;
  char *buffer_local;
  
  if (buffer_len < src_len * 2 + 1) {
    buffer_local = (char *)0xffffffffffffffff;
  }
  else {
    local_40 = (char *)0x0;
    for (j = 0; j < src_len; j = j + 1) {
      pcVar1 = local_40 + 1;
      buffer[(long)local_40] = strhex_from_bin::HEX[(int)(uint)src[j] >> 4];
      local_40 = local_40 + 2;
      buffer[(long)pcVar1] = strhex_from_bin::HEX[(int)(src[j] & 0xf)];
    }
    buffer[(long)local_40] = '\0';
    buffer_local = local_40;
  }
  return (ssize_t)buffer_local;
}

Assistant:

ssize_t
strhex_from_bin(char *buffer, size_t buffer_len, const uint8_t *src, size_t src_len) {
  static char HEX[] = "0123456789abcdef";
  size_t i, j;
  if (buffer_len < src_len*2+1) {
    return -1;
  }

  for (i=0, j=0; i<src_len; i++) {
    buffer[j++] = HEX[src[i] >> 4];
    buffer[j++] = HEX[src[i] & 0x0f];
  }
  buffer[j] = 0;
  return j;
}